

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test::
TestBody(MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test *this)

{
  RepeatedField<int> *pRVar1;
  FieldDescriptor *pFVar2;
  char *in_R9;
  AssertHelper local_2e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2d8;
  FieldDescriptor *rc;
  string local_2c8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  AssertionResult gtest_ar_;
  FieldDescriptor *c;
  TestField msg1;
  TestField msg2;
  MessageDifferencer differencer;
  
  proto2_unittest::TestField::TestField(&msg1);
  proto2_unittest::TestField::TestField(&msg2);
  pRVar1 = &msg1.field_0._impl_.rc_;
  msg1.field_0._impl_.c_ = 3;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  RepeatedField<int>::Add(pRVar1,1);
  RepeatedField<int>::Add(pRVar1,2);
  pRVar1 = &msg2.field_0._impl_.rc_;
  msg2.field_0._impl_.c_ = 3;
  msg2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       msg2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  RepeatedField<int>::Add(pRVar1,1);
  RepeatedField<int>::Add(pRVar1,3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&differencer,"c",(allocator<char> *)&local_2c8);
  pFVar2 = GetFieldDescriptor(&msg1.super_Message,(string *)&differencer);
  std::__cxx11::string::~string((string *)&differencer);
  c = pFVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&differencer,"rc",(allocator<char> *)&local_2c8);
  pFVar2 = GetFieldDescriptor(&msg1.super_Message,(string *)&differencer);
  std::__cxx11::string::~string((string *)&differencer);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc = pFVar2;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back(&fields,&c);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back(&fields,&rc);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::IgnoreField(&differencer,rc);
  util::MessageDifferencer::set_scope(&differencer,FULL);
  gtest_ar_.success_ =
       util::MessageDifferencer::CompareWithFields
                 (&differencer,&msg1.super_Message,&msg2.super_Message,&fields,&fields);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&gtest_ar_,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb0d,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c8);
    if (local_2d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::set_scope(&differencer,PARTIAL);
  gtest_ar_.success_ =
       util::MessageDifferencer::CompareWithFields
                 (&differencer,&msg1.super_Message,&msg2.super_Message,&fields,&fields);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&gtest_ar_,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb10,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c8);
    if (local_2d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  proto2_unittest::TestField::~TestField(&msg2);
  proto2_unittest::TestField::~TestField(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_TrumpsCompareWithFields) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_c(3);
  msg2.add_rc(1);
  msg2.add_rc(3);

  const FieldDescriptor* c = GetFieldDescriptor(msg1, "c");
  const FieldDescriptor* rc = GetFieldDescriptor(msg1, "rc");

  std::vector<const FieldDescriptor*> fields;
  fields.push_back(c);
  fields.push_back(rc);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(rc);

  differencer.set_scope(util::MessageDifferencer::FULL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));

  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));
}